

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O0

void libdef_name(char *p,int kind)

{
  uint8_t *puVar1;
  int iVar2;
  ulong local_20;
  size_t n;
  char *pcStack_10;
  int kind_local;
  char *p_local;
  
  local_20 = strlen(p);
  pcStack_10 = p;
  if ((((kind != 0xc0) && (modnamelen < local_20)) && (p[modnamelen] == '_')) &&
     (iVar2 = strncmp(p,modname,modnamelen), iVar2 == 0)) {
    pcStack_10 = p + modnamelen + 1;
    local_20 = local_20 - (modnamelen + 1);
  }
  if (local_20 < 0x39) {
    if (optr + local_20 + 3 <= &optr) {
      puVar1 = optr + 1;
      *optr = (byte)local_20 | (byte)kind;
      optr = puVar1;
      memcpy(optr,pcStack_10,local_20);
      optr = optr + local_20;
      return;
    }
    fprintf(_stderr,"Error: output buffer overflow\n");
    exit(1);
  }
  fprintf(_stderr,"Error: string too long: \'%s\'\n",pcStack_10);
  exit(1);
}

Assistant:

static void libdef_name(const char *p, int kind)
{
  size_t n = strlen(p);
  if (kind != LIBINIT_STRING) {
    if (n > modnamelen && p[modnamelen] == '_' &&
	!strncmp(p, modname, modnamelen)) {
      p += modnamelen+1;
      n -= modnamelen+1;
    }
  }
  if (n > LIBINIT_MAXSTR) {
    fprintf(stderr, "Error: string too long: '%s'\n",  p);
    exit(1);
  }
  if (optr+1+n+2 > obuf+sizeof(obuf)) {  /* +2 for caller. */
    fprintf(stderr, "Error: output buffer overflow\n");
    exit(1);
  }
  *optr++ = (uint8_t)(n | kind);
  memcpy(optr, p, n);
  optr += n;
}